

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

void mod2sparse_transpose(mod2sparse *m,mod2sparse *r)

{
  byte *pbVar1;
  int col;
  int col_00;
  uint uVar2;
  bool bVar3;
  mod2entry *pmVar4;
  ulong uVar5;
  mod2sparse *r_00;
  mod2sparse *r_01;
  mod2entry *pmVar6;
  void *__s;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if ((m->n_rows == r->n_cols) && (m->n_cols == r->n_rows)) {
    if (r != m) {
      mod2sparse_clear(r);
      if (0 < m->n_rows) {
        lVar9 = 0;
        do {
          for (pmVar4 = m->rows[lVar9].right; -1 < pmVar4->row; pmVar4 = pmVar4->right) {
            mod2sparse_insert(r,pmVar4->col,(int)lVar9);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < m->n_rows);
      }
      return;
    }
  }
  else {
    mod2sparse_transpose_cold_1();
  }
  mod2sparse_transpose_cold_2();
  if ((((m->n_rows == r_00->n_rows) && (m->n_cols == r_00->n_cols)) && (r->n_rows == r_00->n_rows))
     && (r->n_cols == r_00->n_cols)) {
    if ((r_00 != m) && (r_00 != r)) {
      mod2sparse_clear(r_00);
      if (0 < r_00->n_rows) {
        lVar9 = 0;
        do {
          pmVar4 = m->rows[lVar9].right;
          pmVar6 = r->rows[lVar9].right;
          while ((iVar7 = (int)lVar9, -1 < pmVar4->row && (-1 < pmVar6->row))) {
            col = pmVar4->col;
            col_00 = pmVar6->col;
            if (col == col_00) {
              pmVar4 = pmVar4->right;
LAB_0012321b:
              pmVar6 = pmVar6->right;
            }
            else {
              if (col_00 <= col) {
                mod2sparse_insert(r_00,iVar7,col_00);
                goto LAB_0012321b;
              }
              mod2sparse_insert(r_00,iVar7,col);
              pmVar4 = pmVar4->right;
            }
          }
          for (; -1 < pmVar4->row; pmVar4 = pmVar4->right) {
            mod2sparse_insert(r_00,iVar7,pmVar4->col);
          }
          for (; -1 < pmVar6->row; pmVar6 = pmVar6->right) {
            mod2sparse_insert(r_00,iVar7,pmVar6->col);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < r_00->n_rows);
      }
      return;
    }
  }
  else {
    mod2sparse_add_cold_1();
  }
  mod2sparse_add_cold_2();
  if (((m->n_cols == r->n_rows) && (m->n_rows == r_01->n_rows)) && (r->n_cols == r_01->n_cols)) {
    if ((r_01 != m) && (r_01 != r)) {
      mod2sparse_clear(r_01);
      if (0 < m->n_rows) {
        lVar9 = 0;
        do {
          if ((-1 < (m->rows[lVar9].right)->row) && (0 < r->n_cols)) {
            lVar8 = 0;
            do {
              pmVar4 = m->rows[lVar9].right;
              if (-1 < pmVar4->row) {
                pmVar6 = r->cols[lVar8].down;
                bVar3 = false;
                do {
                  iVar7 = pmVar6->row;
                  if (iVar7 < 0) break;
                  if (pmVar4->col == iVar7) {
                    bVar3 = (bool)(bVar3 ^ 1);
                    pmVar4 = pmVar4->right;
LAB_0012332e:
                    pmVar6 = pmVar6->down;
                  }
                  else {
                    if (iVar7 <= pmVar4->col) goto LAB_0012332e;
                    pmVar4 = pmVar4->right;
                  }
                } while (-1 < pmVar4->row);
                if (bVar3) {
                  mod2sparse_insert(r_01,(int)lVar9,(int)lVar8);
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < r->n_cols);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < m->n_rows);
      }
      return;
    }
  }
  else {
    mod2sparse_multiply_cold_1();
  }
  mod2sparse_multiply_cold_2();
  uVar2 = m->n_cols;
  if (0 < (long)m->n_rows) {
    memset(__s,0,(long)m->n_rows);
  }
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      if (*(char *)((long)&r->n_rows + uVar5) != '\0') {
        for (pmVar4 = m->cols[uVar5].down; -1 < pmVar4->row; pmVar4 = pmVar4->down) {
          pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar4->row);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2);
  }
  return;
}

Assistant:

void mod2sparse_transpose
( mod2sparse *m,	/* Matrix to compute transpose of (left unchanged) */
  mod2sparse *r		/* Result of transpose operation */
)
{
  mod2entry *e;
  int i;

  if (mod2sparse_rows(m)!=mod2sparse_cols(r) 
   || mod2sparse_cols(m)!=mod2sparse_rows(r))
  { fprintf(stderr,
     "mod2sparse_transpose: Matrices have incompatible dimensions\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
     "mod2sparse_transpose: Result matrix is the same as the operand\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(m); i++)
  {
    e = mod2sparse_first_in_row(m,i);

    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,mod2sparse_col(e),i);
      e = mod2sparse_next_in_row(e);
    }
  }
}